

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O3

void Eigen::internal::
     apply_rotation_in_the_plane<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double>
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *_x,
               Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *_y,
               JacobiRotation<double> *j)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  PointerType pdVar7;
  PointerType pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  
  uVar6 = (_x->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>)
          .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value;
  if (uVar6 != (_y->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>)
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_rows.m_value) {
    __assert_fail("_x.size() == _y.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Jacobi/Jacobi.h"
                  ,0x133,
                  "void Eigen::internal::apply_rotation_in_the_plane(VectorX &, VectorY &, const JacobiRotation<OtherScalar> &) [VectorX = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, VectorY = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherScalar = double]"
                 );
  }
  pdVar7 = (_x->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
           ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_data;
  pdVar8 = (_y->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
           ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_data;
  dVar2 = j->m_c;
  dVar3 = j->m_s;
  if ((((dVar2 != 1.0) || (NAN(dVar2))) || (dVar3 != 0.0)) || (NAN(dVar3))) {
    uVar15 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1);
    if ((long)uVar6 <= (long)uVar15) {
      uVar15 = uVar6;
    }
    if (((ulong)pdVar8 & 7) != 0) {
      uVar15 = uVar6;
    }
    uVar19 = uVar6 - uVar15;
    uVar18 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
    if (0 < (long)uVar15) {
      uVar16 = 0;
      do {
        dVar4 = pdVar7[uVar16];
        dVar5 = pdVar8[uVar16];
        pdVar7[uVar16] = dVar2 * dVar4 + dVar3 * dVar5;
        pdVar8[uVar16] = dVar4 * -dVar3 + dVar5 * dVar2;
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    lVar17 = uVar18 + uVar15;
    uVar16 = (ulong)((uint)((ulong)pdVar7 >> 3) & 1);
    if ((long)uVar6 <= (long)uVar16) {
      uVar16 = uVar6;
    }
    if (((ulong)pdVar7 & 7) != 0) {
      uVar16 = uVar6;
    }
    if (uVar16 == uVar15) {
      if (1 < (long)uVar19) {
        do {
          dVar4 = pdVar7[uVar15];
          dVar5 = (pdVar7 + uVar15)[1];
          dVar9 = pdVar8[uVar15];
          dVar10 = (pdVar8 + uVar15)[1];
          pdVar7[uVar15] = dVar3 * dVar9 + dVar2 * dVar4;
          (pdVar7 + uVar15)[1] = dVar3 * dVar10 + dVar2 * dVar5;
          pdVar8[uVar15] = dVar9 * dVar2 - dVar4 * dVar3;
          (pdVar8 + uVar15)[1] = dVar10 * dVar2 - dVar5 * dVar3;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < lVar17);
      }
    }
    else {
      uVar16 = uVar19 + 3;
      if (-1 < (long)uVar19) {
        uVar16 = uVar19;
      }
      lVar1 = (uVar16 & 0xfffffffffffffffc) + uVar15;
      if (3 < (long)uVar19) {
        do {
          dVar4 = pdVar7[uVar15];
          dVar5 = (pdVar7 + uVar15)[1];
          dVar9 = pdVar7[uVar15 + 2];
          dVar10 = (pdVar7 + uVar15 + 2)[1];
          dVar11 = pdVar8[uVar15];
          dVar12 = (pdVar8 + uVar15)[1];
          dVar13 = pdVar8[uVar15 + 2];
          dVar14 = (pdVar8 + uVar15 + 2)[1];
          pdVar7[uVar15] = dVar3 * dVar11 + dVar2 * dVar4;
          (pdVar7 + uVar15)[1] = dVar3 * dVar12 + dVar2 * dVar5;
          pdVar7[uVar15 + 2] = dVar3 * dVar13 + dVar2 * dVar9;
          (pdVar7 + uVar15 + 2)[1] = dVar3 * dVar14 + dVar2 * dVar10;
          pdVar8[uVar15] = dVar11 * dVar2 - dVar4 * dVar3;
          (pdVar8 + uVar15)[1] = dVar12 * dVar2 - dVar5 * dVar3;
          pdVar8[uVar15 + 2] = dVar13 * dVar2 - dVar9 * dVar3;
          (pdVar8 + uVar15 + 2)[1] = dVar14 * dVar2 - dVar10 * dVar3;
          uVar15 = uVar15 + 4;
        } while ((long)uVar15 < lVar1);
      }
      if (uVar18 != (uVar16 & 0xfffffffffffffffc)) {
        dVar4 = pdVar7[lVar1];
        dVar5 = (pdVar7 + lVar1)[1];
        dVar9 = pdVar8[lVar1];
        dVar10 = (pdVar8 + lVar1)[1];
        pdVar7[lVar1] = dVar3 * dVar9 + dVar2 * dVar4;
        (pdVar7 + lVar1)[1] = dVar3 * dVar10 + dVar2 * dVar5;
        pdVar8[lVar1] = dVar2 * dVar9 - dVar3 * dVar4;
        (pdVar8 + lVar1)[1] = dVar2 * dVar10 - dVar3 * dVar5;
      }
    }
    if (lVar17 < (long)uVar6) {
      do {
        dVar4 = pdVar7[lVar17];
        dVar5 = pdVar8[lVar17];
        pdVar7[lVar17] = dVar2 * dVar4 + dVar3 * dVar5;
        pdVar8[lVar17] = dVar4 * -dVar3 + dVar5 * dVar2;
        lVar17 = lVar17 + 1;
      } while (lVar17 < (long)uVar6);
    }
  }
  return;
}

Assistant:

void /*EIGEN_DONT_INLINE*/ apply_rotation_in_the_plane(VectorX& _x, VectorY& _y, const JacobiRotation<OtherScalar>& j)
{
  typedef typename VectorX::Index Index;
  typedef typename VectorX::Scalar Scalar;
  enum { PacketSize = packet_traits<Scalar>::size };
  typedef typename packet_traits<Scalar>::type Packet;
  eigen_assert(_x.size() == _y.size());
  Index size = _x.size();
  Index incrx = _x.innerStride();
  Index incry = _y.innerStride();

  Scalar* EIGEN_RESTRICT x = &_x.coeffRef(0);
  Scalar* EIGEN_RESTRICT y = &_y.coeffRef(0);
  
  OtherScalar c = j.c();
  OtherScalar s = j.s();
  if (c==OtherScalar(1) && s==OtherScalar(0))
    return;

  /*** dynamic-size vectorized paths ***/

  if(VectorX::SizeAtCompileTime == Dynamic &&
    (VectorX::Flags & VectorY::Flags & PacketAccessBit) &&
    ((incrx==1 && incry==1) || PacketSize == 1))
  {
    // both vectors are sequentially stored in memory => vectorization
    enum { Peeling = 2 };

    Index alignedStart = internal::first_aligned(y, size);
    Index alignedEnd = alignedStart + ((size-alignedStart)/PacketSize)*PacketSize;

    const Packet pc = pset1<Packet>(c);
    const Packet ps = pset1<Packet>(s);
    conj_helper<Packet,Packet,NumTraits<Scalar>::IsComplex,false> pcj;

    for(Index i=0; i<alignedStart; ++i)
    {
      Scalar xi = x[i];
      Scalar yi = y[i];
      x[i] =  c * xi + numext::conj(s) * yi;
      y[i] = -s * xi + numext::conj(c) * yi;
    }

    Scalar* EIGEN_RESTRICT px = x + alignedStart;
    Scalar* EIGEN_RESTRICT py = y + alignedStart;

    if(internal::first_aligned(x, size)==alignedStart)
    {
      for(Index i=alignedStart; i<alignedEnd; i+=PacketSize)
      {
        Packet xi = pload<Packet>(px);
        Packet yi = pload<Packet>(py);
        pstore(px, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
        pstore(py, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
        px += PacketSize;
        py += PacketSize;
      }
    }
    else
    {
      Index peelingEnd = alignedStart + ((size-alignedStart)/(Peeling*PacketSize))*(Peeling*PacketSize);
      for(Index i=alignedStart; i<peelingEnd; i+=Peeling*PacketSize)
      {
        Packet xi   = ploadu<Packet>(px);
        Packet xi1  = ploadu<Packet>(px+PacketSize);
        Packet yi   = pload <Packet>(py);
        Packet yi1  = pload <Packet>(py+PacketSize);
        pstoreu(px, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
        pstoreu(px+PacketSize, padd(pmul(pc,xi1),pcj.pmul(ps,yi1)));
        pstore (py, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
        pstore (py+PacketSize, psub(pcj.pmul(pc,yi1),pmul(ps,xi1)));
        px += Peeling*PacketSize;
        py += Peeling*PacketSize;
      }
      if(alignedEnd!=peelingEnd)
      {
        Packet xi = ploadu<Packet>(x+peelingEnd);
        Packet yi = pload <Packet>(y+peelingEnd);
        pstoreu(x+peelingEnd, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
        pstore (y+peelingEnd, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
      }
    }

    for(Index i=alignedEnd; i<size; ++i)
    {
      Scalar xi = x[i];
      Scalar yi = y[i];
      x[i] =  c * xi + numext::conj(s) * yi;
      y[i] = -s * xi + numext::conj(c) * yi;
    }
  }

  /*** fixed-size vectorized path ***/
  else if(VectorX::SizeAtCompileTime != Dynamic &&
          (VectorX::Flags & VectorY::Flags & PacketAccessBit) &&
          (VectorX::Flags & VectorY::Flags & AlignedBit))
  {
    const Packet pc = pset1<Packet>(c);
    const Packet ps = pset1<Packet>(s);
    conj_helper<Packet,Packet,NumTraits<Scalar>::IsComplex,false> pcj;
    Scalar* EIGEN_RESTRICT px = x;
    Scalar* EIGEN_RESTRICT py = y;
    for(Index i=0; i<size; i+=PacketSize)
    {
      Packet xi = pload<Packet>(px);
      Packet yi = pload<Packet>(py);
      pstore(px, padd(pmul(pc,xi),pcj.pmul(ps,yi)));
      pstore(py, psub(pcj.pmul(pc,yi),pmul(ps,xi)));
      px += PacketSize;
      py += PacketSize;
    }
  }

  /*** non-vectorized path ***/
  else
  {
    for(Index i=0; i<size; ++i)
    {
      Scalar xi = *x;
      Scalar yi = *y;
      *x =  c * xi + numext::conj(s) * yi;
      *y = -s * xi + numext::conj(c) * yi;
      x += incrx;
      y += incry;
    }
  }
}